

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXMeshGeometry.cpp
# Opt level: O3

uint __thiscall Assimp::FBX::MeshGeometry::FaceForVertexIndex(MeshGeometry *this,uint in_index)

{
  pointer puVar1;
  uint *puVar2;
  ulong uVar3;
  uint *puVar4;
  uint *puVar5;
  uint uVar6;
  ulong uVar7;
  value_type_conflict1 local_1c;
  
  uVar3 = ((long)(this->m_vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_finish -
           (long)(this->m_vertices).
                 super__Vector_base<aiVector3t<float>,_std::allocator<aiVector3t<float>_>_>._M_impl.
                 super__Vector_impl_data._M_start >> 2) * -0x5555555555555555;
  if (uVar3 < in_index || uVar3 - in_index == 0) {
    __assert_fail("in_index < m_vertices.size()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                  ,0x101,
                  "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
  }
  puVar2 = (this->m_facesVertexStartIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar5 = (this->m_facesVertexStartIndices).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar2 == puVar5) {
    local_1c = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::resize
              (&this->m_facesVertexStartIndices,
               ((long)(this->m_faces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_finish -
                (long)(this->m_faces).
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_start >> 2) + 1,&local_1c);
    puVar2 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar5 = (this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
             .super__Vector_impl_data._M_finish;
    if (puVar2 != puVar5) {
      puVar1 = (this->m_facesVertexStartIndices).
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      uVar6 = *puVar2;
      puVar1[1] = uVar6;
      puVar2 = puVar2 + 1;
      if (puVar2 != puVar5) {
        puVar4 = puVar1 + 2;
        do {
          uVar6 = uVar6 + *puVar2;
          *puVar4 = uVar6;
          puVar2 = puVar2 + 1;
          puVar4 = puVar4 + 1;
        } while (puVar2 != puVar5);
      }
    }
    puVar2 = (this->m_facesVertexStartIndices).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar5 = (this->m_facesVertexStartIndices).
             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    (this->m_facesVertexStartIndices).
    super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.super__Vector_impl_data.
    _M_finish = puVar5;
  }
  if ((long)puVar5 - (long)puVar2 ==
      (long)(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)(this->m_faces).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start) {
    uVar3 = (long)puVar5 - (long)puVar2 >> 2;
    puVar5 = puVar2;
    while (puVar4 = puVar5, 0 < (long)uVar3) {
      uVar7 = uVar3 >> 1;
      uVar3 = ~uVar7 + uVar3;
      puVar5 = puVar4 + uVar7 + 1;
      if (in_index < puVar4[uVar7]) {
        uVar3 = uVar7;
        puVar5 = puVar4;
      }
    }
    return (uint)((ulong)((long)puVar4 + (-4 - (long)puVar2)) >> 2);
  }
  __assert_fail("m_facesVertexStartIndices.size() == m_faces.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/FBX/FBXMeshGeometry.cpp"
                ,0x10c,
                "unsigned int Assimp::FBX::MeshGeometry::FaceForVertexIndex(unsigned int) const");
}

Assistant:

unsigned int MeshGeometry::FaceForVertexIndex( unsigned int in_index ) const {
    ai_assert( in_index < m_vertices.size() );

    // in the current conversion pattern this will only be needed if
    // weights are present, so no need to always pre-compute this table
    if ( m_facesVertexStartIndices.empty() ) {
        m_facesVertexStartIndices.resize( m_faces.size() + 1, 0 );

        std::partial_sum( m_faces.begin(), m_faces.end(), m_facesVertexStartIndices.begin() + 1 );
        m_facesVertexStartIndices.pop_back();
    }

    ai_assert( m_facesVertexStartIndices.size() == m_faces.size() );
    const std::vector<unsigned int>::iterator it = std::upper_bound(
        m_facesVertexStartIndices.begin(),
        m_facesVertexStartIndices.end(),
        in_index
        );

    return static_cast< unsigned int >( std::distance( m_facesVertexStartIndices.begin(), it - 1 ) );
}